

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O3

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs,uint8_t *src,size_t srclen)

{
  uint8_t **ppuVar1;
  int iVar2;
  nghttp2_buf_chain *pnVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  pnVar3 = bufs->cur;
  uVar5 = (long)(pnVar3->buf).end - (long)(pnVar3->buf).last;
  pbVar9 = src + srclen;
  uVar7 = 0;
  uVar8 = 0;
  while (src != pbVar9) {
    bVar6 = *src;
    src = src + 1;
    uVar7 = uVar7 | (ulong)huff_sym_table[bVar6].code << (-((char)uVar8 + ' ') & 0x3fU);
    uVar8 = uVar8 + huff_sym_table[bVar6].nbits;
    if (0x1f < uVar8) {
      if (uVar5 < 4) {
        do {
          iVar2 = nghttp2_bufs_addb(bufs,(uint8_t)(uVar7 >> 0x38));
          if (iVar2 != 0) {
            return iVar2;
          }
          uVar7 = uVar7 << 8;
          uVar8 = uVar8 - 8;
        } while (7 < uVar8);
        pnVar3 = bufs->cur;
        uVar5 = (long)(pnVar3->buf).end - (long)(pnVar3->buf).last;
      }
      else {
        uVar4 = (uint)(uVar7 >> 0x20);
        *(uint *)(pnVar3->buf).last =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        pnVar3 = bufs->cur;
        ppuVar1 = &(pnVar3->buf).last;
        *ppuVar1 = *ppuVar1 + 4;
        uVar5 = uVar5 - 4;
        uVar7 = uVar7 << 0x20;
        uVar8 = uVar8 - 0x20;
      }
    }
  }
  while( true ) {
    bVar6 = (byte)(uVar7 >> 0x38);
    if (uVar8 < 8) {
      if ((uVar8 == 0) ||
         (iVar2 = nghttp2_bufs_addb(bufs,~(byte)(-1 << (8U - (char)uVar8 & 0x1f)) | bVar6),
         iVar2 == 0)) {
        iVar2 = 0;
      }
      return iVar2;
    }
    iVar2 = nghttp2_bufs_addb(bufs,bVar6);
    if (iVar2 != 0) break;
    uVar7 = uVar7 << 8;
    uVar8 = uVar8 - 8;
  }
  return iVar2;
}

Assistant:

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs, const uint8_t *src,
                           size_t srclen) {
  const nghttp2_huff_sym *sym;
  const uint8_t *end = src + srclen;
  uint64_t code = 0;
  uint32_t x;
  size_t nbits = 0;
  size_t avail;
  int rv;

  avail = nghttp2_bufs_cur_avail(bufs);

  for (; src != end;) {
    sym = &huff_sym_table[*src++];
    code |= (uint64_t)sym->code << (32 - nbits);
    nbits += sym->nbits;
    if (nbits < 32) {
      continue;
    }
    if (avail >= 4) {
      x = htonl((uint32_t)(code >> 32));
      memcpy(bufs->cur->buf.last, &x, 4);
      bufs->cur->buf.last += 4;
      avail -= 4;
      code <<= 32;
      nbits -= 32;
      continue;
    }

    for (; nbits >= 8;) {
      rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
      if (rv != 0) {
        return rv;
      }
      code <<= 8;
      nbits -= 8;
    }

    avail = nghttp2_bufs_cur_avail(bufs);
  }

  for (; nbits >= 8;) {
    rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
    if (rv != 0) {
      return rv;
    }
    code <<= 8;
    nbits -= 8;
  }

  if (nbits) {
    rv = nghttp2_bufs_addb(
      bufs, (uint8_t)((uint8_t)(code >> 56) | ((1 << (8 - nbits)) - 1)));
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}